

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O2

bool Diligent::PipelineResourceLayoutDesc::IsEqual
               (PipelineResourceLayoutDesc *Desc1,PipelineResourceLayoutDesc *Desc2,
               bool IgnoreVariables,bool IgnoreSamplers)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((((Desc1->DefaultVariableType == Desc2->DefaultVariableType) &&
       (Desc1->DefaultVariableMergeStages == Desc2->DefaultVariableMergeStages)) &&
      (Desc1->NumVariables == Desc2->NumVariables)) &&
     (Desc1->NumImmutableSamplers == Desc2->NumImmutableSamplers)) {
    if (IgnoreVariables) {
LAB_00161cff:
      bVar4 = true;
      if (!IgnoreSamplers) {
        uVar3 = 0xffffffffffffffff;
        lVar2 = 0;
        do {
          uVar3 = uVar3 + 1;
          bVar4 = Desc1->NumImmutableSamplers <= uVar3;
          if (bVar4) {
            return bVar4;
          }
          bVar1 = ImmutableSamplerDesc::operator!=
                            ((ImmutableSamplerDesc *)
                             ((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar2 + -0x2c),
                             (ImmutableSamplerDesc *)
                             ((long)(Desc2->ImmutableSamplers->Desc).BorderColor + lVar2 + -0x2c));
          lVar2 = lVar2 + 0x48;
        } while (!bVar1);
      }
    }
    else {
      uVar3 = 0xffffffffffffffff;
      bVar4 = false;
      lVar2 = 0;
      do {
        uVar3 = uVar3 + 1;
        if (Desc1->NumVariables <= uVar3) goto LAB_00161cff;
        bVar1 = ShaderResourceVariableDesc::operator!=
                          ((ShaderResourceVariableDesc *)((long)&Desc1->Variables->Name + lVar2),
                           (ShaderResourceVariableDesc *)((long)&Desc2->Variables->Name + lVar2));
        lVar2 = lVar2 + 0x10;
      } while (!bVar1);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool IsEqual(const PipelineResourceLayoutDesc& Desc1,
                        const PipelineResourceLayoutDesc& Desc2,
                        bool                              IgnoreVariables = false,
                        bool                              IgnoreSamplers  = false)
    {
        if (!(Desc1.DefaultVariableType        == Desc2.DefaultVariableType        &&
              Desc1.DefaultVariableMergeStages == Desc2.DefaultVariableMergeStages &&
              Desc1.NumVariables               == Desc2.NumVariables               &&
              Desc1.NumImmutableSamplers       == Desc2.NumImmutableSamplers))
           return false;

        if (!IgnoreVariables)
        {
            for (Uint32 i = 0; i < Desc1.NumVariables; ++i)
                if (Desc1.Variables[i] != Desc2.Variables[i])
                    return false;
        }

        if (!IgnoreSamplers)
        {
            for (Uint32 i = 0; i < Desc1.NumImmutableSamplers; ++i)
                if (Desc1.ImmutableSamplers[i] != Desc2.ImmutableSamplers[i])
                    return false;
        }

        return true;
    }